

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O2

void __thiscall HN::State::requestJSONForURI(State *this,string *uri)

{
  string local_30;
  
  snprintf(this->curURI,0x200,"%s",(uri->_M_dataplus)._M_p);
  std::__cxx11::string::string((string *)&local_30,(string *)uri);
  requestJSONForURI_impl(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void State::requestJSONForURI(std::string uri) {
        snprintf(curURI, 512, "%s", uri.c_str());

        requestJSONForURI_impl(std::move(uri));
    }